

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_int,5,6,15,2u>
          (Float<unsigned_int,_5,_6,_15,_2U> *other)

{
  uint uVar1;
  StorageType SVar2;
  ulong uVar3;
  uint uVar4;
  StorageType_conflict1 SVar5;
  ulong uVar6;
  
  uVar4 = other->m_value;
  if ((uVar4 & 0x7ff) == 0x7c0) {
    SVar5 = 0xfff0000000000000;
    if ((uVar4 >> 0xb & 1) == 0) {
      SVar5 = 0x7ff0000000000000;
    }
  }
  else if ((~uVar4 & 0x7c0) == 0 && (uVar4 & 0x3f) != 0) {
    SVar5 = 0x7fffffffffffffff;
  }
  else {
    if ((uVar4 & 0x7ff) != 0) {
      uVar1 = Float<unsigned_int,_5,_6,_15,_2U>::exponent(other);
      SVar2 = Float<unsigned_int,_5,_6,_15,_2U>::mantissa(other);
      for (uVar3 = (ulong)SVar2; (uVar3 & 0x40) == 0; uVar3 = uVar3 * 2) {
        uVar1 = uVar1 - 1;
      }
      uVar6 = (ulong)(uVar4 >> 0xb & 1) << 0x3f;
      if (-0x3ff < (int)uVar1) {
        if ((int)uVar1 < 0x400) {
          return (Float<unsigned_long,_11,_52,_1023,_3U>)
                 (uVar6 | (ulong)(uVar1 + 0x3ff) << 0x34 | (ulong)((uint)uVar3 & 0x3ffbf) << 0x2e);
        }
        if ((other->m_value & 0x800) != 0) {
          return (Float<unsigned_long,_11,_52,_1023,_3U>)0xfff0000000000000;
        }
        return (Float<unsigned_long,_11,_52,_1023,_3U>)0x7ff0000000000000;
      }
      if (0xfffffbcc < uVar1) {
        return (Float<unsigned_long,_11,_52,_1023,_3U>)
               (uVar6 | ~(-1L << (-(char)uVar1 - 0x2dU & 0x3f)) + uVar3 +
                        (ulong)((uVar3 >> ((ulong)(-uVar1 - 0x42c) & 0x3f) & 1) != 0) >>
                        ((byte)(-uVar1 - 0x42c) & 0x3f));
      }
      uVar4 = other->m_value & 0x800;
    }
    SVar5 = (ulong)uVar4 << 0x34;
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)SVar5;
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}